

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_24497e::ImageOptimizer::provideStreamData
          (ImageOptimizer *this,QPDFObjGen *param_1,Pipeline *pipeline)

{
  bool bVar1;
  element_type *p_00;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  undefined1 local_50 [40];
  shared_ptr<Pipeline> p;
  Pipeline *pipeline_local;
  QPDFObjGen *param_1_local;
  ImageOptimizer *this_local;
  
  p.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pipeline;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"",&local_51);
  makePipeline((ImageOptimizer *)(local_50 + 0x20),(string *)this,(Pipeline *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::allocator<char>::~allocator(&local_51);
  bVar1 = std::operator==((shared_ptr<Pipeline> *)(local_50 + 0x20),(nullptr_t)0x0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,
               "unable to create pipeline after previous success; image data will be lost",&local_89
              );
    QPDFObjectHandle::warnIfPossible(&this->image,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    (*(p.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _vptr__Sp_counted_base[3])();
  }
  else {
    p_00 = std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> *)(local_50 + 0x20));
    QPDFObjectHandle::pipeStreamData(&this->image,p_00,0,this->decode_level,false,false);
  }
  std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)(local_50 + 0x20));
  return;
}

Assistant:

void
ImageOptimizer::provideStreamData(QPDFObjGen const&, Pipeline* pipeline)
{
    std::shared_ptr<Pipeline> p = makePipeline("", pipeline);
    if (p == nullptr) {
        // Should not be possible
        image.warnIfPossible(
            "unable to create pipeline after previous success; image data will be lost");
        pipeline->finish();
        return;
    }
    image.pipeStreamData(p.get(), 0, decode_level, false, false);
}